

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int add_import(JSParseState *s,JSModuleDef *m,JSAtom param_3,JSAtom import_name)

{
  JSContext *ctx;
  JSImportEntry *pJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *fmt;
  int iVar7;
  
  ctx = s->ctx;
  if (param_3 != 0x16) {
    if ((param_3 == 0x3a) || (param_3 == 0x4d)) {
      fmt = "invalid import binding";
LAB_0015f759:
      js_parse_error(s,fmt);
      return -1;
    }
    lVar5 = (long)s->cur_func->closure_var_count;
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        if (s->cur_func->closure_var[lVar6].var_name == param_3) {
          fmt = "duplicate import binding";
          goto LAB_0015f759;
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
  }
  iVar3 = add_closure_var(ctx,s->cur_func,(uint)(import_name == 0x7d),0,m->import_entries_count,
                          param_3,1,1,JS_VAR_NORMAL);
  iVar7 = -1;
  if ((-1 < iVar3) &&
     ((m->import_entries_count < m->import_entries_size ||
      (iVar4 = js_realloc_array(ctx,&m->import_entries,0xc,&m->import_entries_size,
                                m->import_entries_count + 1), iVar4 == 0)))) {
    iVar7 = m->import_entries_count;
    m->import_entries_count = iVar7 + 1;
    pJVar1 = m->import_entries;
    if (0xd1 < (int)import_name) {
      pJVar2 = ctx->rt->atom_array[import_name];
      (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
    }
    pJVar1[iVar7].import_name = import_name;
    pJVar1[iVar7].var_idx = iVar3;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int add_import(JSParseState *s, JSModuleDef *m,
                      JSAtom local_name, JSAtom import_name)
{
    JSContext *ctx = s->ctx;
    int i, var_idx;
    JSImportEntry *mi;
    BOOL is_local;

    if (local_name == JS_ATOM_arguments || local_name == JS_ATOM_eval)
        return js_parse_error(s, "invalid import binding");

    if (local_name != JS_ATOM_default) {
        for (i = 0; i < s->cur_func->closure_var_count; i++) {
            if (s->cur_func->closure_var[i].var_name == local_name)
                return js_parse_error(s, "duplicate import binding");
        }
    }

    is_local = (import_name == JS_ATOM__star_);
    var_idx = add_closure_var(ctx, s->cur_func, is_local, FALSE,
                              m->import_entries_count,
                              local_name, TRUE, TRUE, FALSE);
    if (var_idx < 0)
        return -1;
    if (js_resize_array(ctx, (void **)&m->import_entries,
                        sizeof(JSImportEntry),
                        &m->import_entries_size,
                        m->import_entries_count + 1))
        return -1;
    mi = &m->import_entries[m->import_entries_count++];
    mi->import_name = JS_DupAtom(ctx, import_name);
    mi->var_idx = var_idx;
    return 0;
}